

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControlPrivate::activateLinkUnderCursor(QWidgetTextControlPrivate *this,QString href)

{
  QTextCursor *pQVar1;
  QArrayData *pQVar2;
  QString *pQVar3;
  undefined1 *puVar4;
  long lVar5;
  undefined8 uVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  MoveMode MVar11;
  int iVar12;
  QString *in_RSI;
  long in_FS_OFFSET;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QTextCursor oldCursor;
  QTextCursor tmp;
  undefined1 *local_a0;
  QTextFormat local_98 [16];
  QArrayData *local_88;
  storage_type_conflict *psStack_80;
  int local_78;
  undefined4 uStack_74;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [12];
  int iStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = &this->cursor;
  QTextCursor::QTextCursor((QTextCursor *)&local_a0,pQVar1);
  if (*(long *)(in_RSI + 0x10) == 0) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&local_68,pQVar1);
    iVar9 = QTextCursor::selectionStart();
    iVar10 = QTextCursor::position();
    if (iVar9 != iVar10) {
      MVar11 = QTextCursor::selectionStart();
      QTextCursor::setPosition((int)&local_68,MVar11);
    }
    QTextCursor::movePosition((MoveOperation)&local_68,0x11,0);
    QTextCursor::charFormat();
    QTextFormat::stringProperty((int)local_58);
    pQVar2 = *(QArrayData **)in_RSI;
    pQVar3 = *(QString **)(in_RSI + 8);
    *(undefined8 *)in_RSI = local_58._0_8_;
    *(QString **)(in_RSI + 8) = stack0xffffffffffffffb0;
    puVar4 = *(undefined1 **)(in_RSI + 0x10);
    *(undefined1 **)(in_RSI + 0x10) = local_48;
    local_58._0_8_ = pQVar2;
    unique0x100007fd = pQVar3;
    local_48 = puVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_88);
    QTextCursor::~QTextCursor((QTextCursor *)&local_68);
    if (*(long *)(in_RSI + 0x10) == 0) goto LAB_004c3ab5;
  }
  cVar7 = QTextCursor::hasSelection();
  if (cVar7 == '\0') {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::block();
    iVar9 = QTextCursor::position();
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    if ((int)local_48 != iStack_4c) {
      do {
        local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        psStack_80 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::iterator::fragment();
        iVar10 = QTextFragment::position();
        if ((iVar10 <= iVar9) &&
           (iVar12 = QTextFragment::length(), pQVar3 = stack0xffffffffffffffb0,
           uVar6 = local_58._0_8_, iVar9 < iVar12 + iVar10)) {
          iVar9 = (int)local_48;
          if ((int)local_48 != iStack_4c) {
            QTextBlock::iterator::fragment();
            MVar11 = QTextFragment::position();
            iVar10 = (int)pQVar1;
            QTextCursor::setPosition(iVar10,MVar11);
            QTextBlock::begin();
            if (((QArrayData *)local_58._0_8_ == local_88) && ((int)local_48 == local_78))
            goto LAB_004c3922;
            goto LAB_004c383e;
          }
          break;
        }
        QTextBlock::iterator::operator++((iterator *)local_58);
      } while ((int)local_48 != iStack_4c);
    }
  }
  goto LAB_004c3a2b;
  while( true ) {
    MVar11 = QTextFragment::position();
    QTextCursor::setPosition(iVar10,MVar11);
    QTextBlock::begin();
    if (((QArrayData *)local_58._0_8_ == local_88) && ((int)local_48 == local_78)) break;
LAB_004c383e:
    QTextBlock::iterator::operator--((iterator *)local_58);
    QTextBlock::iterator::fragment();
    QTextFragment::charFormat();
    QTextFormat::stringProperty((int)&local_88);
    lVar5 = CONCAT44(uStack_74,local_78);
    bVar8 = 1;
    if (lVar5 == *(long *)(in_RSI + 0x10)) {
      QVar13.m_data = psStack_80;
      QVar13.m_size = lVar5;
      QVar15.m_data = *(storage_type_conflict **)(in_RSI + 8);
      QVar15.m_size = lVar5;
      bVar8 = QtPrivate::equalStrings(QVar13,QVar15);
      bVar8 = bVar8 ^ 1;
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,0x10);
      }
    }
    QTextFormat::~QTextFormat(local_98);
    if (bVar8 != 0) break;
  }
LAB_004c3922:
  local_48 = (undefined1 *)CONCAT44(local_48._4_4_,iVar9);
  local_58._0_8_ = uVar6;
  unique0x100007f5 = pQVar3;
  do {
    QTextBlock::iterator::fragment();
    QTextFragment::charFormat();
    QTextFormat::stringProperty((int)&local_88);
    lVar5 = CONCAT44(uStack_74,local_78);
    bVar8 = 1;
    if (lVar5 == *(long *)(in_RSI + 0x10)) {
      QVar14.m_data = psStack_80;
      QVar14.m_size = lVar5;
      QVar16.m_data = *(storage_type_conflict **)(in_RSI + 8);
      QVar16.m_size = lVar5;
      bVar8 = QtPrivate::equalStrings(QVar14,QVar16);
      bVar8 = bVar8 ^ 1;
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,0x10);
      }
    }
    QTextFormat::~QTextFormat(local_98);
    if (bVar8 != 0) break;
    iVar9 = QTextFragment::position();
    iVar12 = QTextFragment::length();
    QTextCursor::setPosition(iVar10,iVar9 + iVar12);
    QTextBlock::iterator::operator++((iterator *)local_58);
  } while ((int)local_48 != iStack_4c);
LAB_004c3a2b:
  if (this->hasFocus == true) {
    this->cursorIsFocusIndicator = true;
  }
  else {
    this->cursorIsFocusIndicator = false;
    QTextCursor::clearSelection();
  }
  repaintOldAndNewSelection(this,(QTextCursor *)&local_a0);
  if (this->openExternalLinks == true) {
    QUrl::QUrl((QUrl *)local_58,in_RSI,TolerantMode);
    QDesktopServices::openUrl((QUrl *)local_58);
    QUrl::~QUrl((QUrl *)local_58);
  }
  else {
    local_58._0_8_ = (QArrayData *)0x0;
    unique0x100007ed = in_RSI;
    QMetaObject::activate
              (*(QObject **)&this->field_0x8,&QWidgetTextControl::staticMetaObject,0xd,
               (void **)local_58);
  }
LAB_004c3ab5:
  QTextCursor::~QTextCursor((QTextCursor *)&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::activateLinkUnderCursor(QString href)
{
    QTextCursor oldCursor = cursor;

    if (href.isEmpty()) {
        QTextCursor tmp = cursor;
        if (tmp.selectionStart() != tmp.position())
            tmp.setPosition(tmp.selectionStart());
        tmp.movePosition(QTextCursor::NextCharacter);
        href = tmp.charFormat().anchorHref();
    }
    if (href.isEmpty())
        return;

    if (!cursor.hasSelection()) {
        QTextBlock block = cursor.block();
        const int cursorPos = cursor.position();

        QTextBlock::Iterator it = block.begin();
        QTextBlock::Iterator linkFragment;

        for (; !it.atEnd(); ++it) {
            QTextFragment fragment = it.fragment();
            const int fragmentPos = fragment.position();
            if (fragmentPos <= cursorPos &&
                fragmentPos + fragment.length() > cursorPos) {
                linkFragment = it;
                break;
            }
        }

        if (!linkFragment.atEnd()) {
            it = linkFragment;
            cursor.setPosition(it.fragment().position());
            if (it != block.begin()) {
                do {
                    --it;
                    QTextFragment fragment = it.fragment();
                    if (fragment.charFormat().anchorHref() != href)
                        break;
                    cursor.setPosition(fragment.position());
                } while (it != block.begin());
            }

            for (it = linkFragment; !it.atEnd(); ++it) {
                QTextFragment fragment = it.fragment();
                if (fragment.charFormat().anchorHref() != href)
                    break;
                cursor.setPosition(fragment.position() + fragment.length(), QTextCursor::KeepAnchor);
            }
        }
    }

    if (hasFocus) {
        cursorIsFocusIndicator = true;
    } else {
        cursorIsFocusIndicator = false;
        cursor.clearSelection();
    }
    repaintOldAndNewSelection(oldCursor);

#ifndef QT_NO_DESKTOPSERVICES
    if (openExternalLinks)
        QDesktopServices::openUrl(href);
    else
#endif
        emit q_func()->linkActivated(href);
}